

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O3

void __thiscall
cimod::
BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
::_initialize_quadmat
          (BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
           *this,DenseMatrix *mat,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *labels_vec,bool fix_format)

{
  pointer pbVar1;
  StorageIndex *pSVar2;
  StorageIndex *pSVar3;
  Scalar *pSVar4;
  StorageIndex *pSVar5;
  Index IVar6;
  Index IVar7;
  undefined4 uVar8;
  ulong uVar9;
  mapped_type *pmVar10;
  Scalar *pSVar11;
  runtime_error *this_00;
  undefined7 in_register_00000009;
  size_t __n;
  ActualDstType actualDst;
  mapped_type mVar12;
  pointer pbVar13;
  long lVar14;
  pointer pbVar15;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  allocator_type local_dd;
  undefined4 local_dc;
  undefined1 local_d8 [80];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&local_68,
             (labels_vec->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (labels_vec->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,0,local_d8,&local_88,&local_dd);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::__detail::_Node_iterator<std::__cxx11::string,true,true>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
             (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              )local_68._M_before_begin._M_nxt,
             (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              )0x0,&local_dd);
  local_dc = (undefined4)CONCAT71(in_register_00000009,fix_format);
  local_d8._16_8_ =
       (this->_idx_to_label).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_idx_to_label).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_88.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_d8._0_8_ =
       (this->_idx_to_label).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_d8._8_8_ =
       (this->_idx_to_label).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->_idx_to_label).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_88.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->_idx_to_label).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_88.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  pbVar1 = (this->_idx_to_label).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar13 = (this->_idx_to_label).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 != pbVar13) {
    uVar9 = (long)pbVar13 - (long)pbVar1 >> 5;
    lVar14 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pbVar1,pbVar13,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pbVar1,pbVar13);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->_label_to_idx)._M_h);
  pbVar1 = (this->_idx_to_label).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar13 = (this->_idx_to_label).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar15 = pbVar13;
  if (pbVar13 != pbVar1) {
    lVar14 = 0;
    mVar12 = 0;
    pbVar13 = pbVar1;
    do {
      pmVar10 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->_label_to_idx,
                             (key_type *)((long)&(pbVar13->_M_dataplus)._M_p + lVar14));
      *pmVar10 = mVar12;
      mVar12 = mVar12 + 1;
      pbVar13 = (this->_idx_to_label).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar15 = (this->_idx_to_label).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar14 = lVar14 + 0x20;
    } while (mVar12 < (ulong)((long)pbVar15 - (long)pbVar13 >> 5));
  }
  if ((mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows ==
      (mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols) {
    lVar14 = (long)pbVar15 - (long)pbVar13 >> 5;
    local_d8._0_8_ = local_d8._0_8_ & 0xffffffffffffff00;
    local_d8._8_8_ = (pointer)0x0;
    local_d8._16_8_ = (pointer)0x0;
    local_d8._24_8_ = (StorageIndex *)0x0;
    local_d8._32_8_ = (StorageIndex *)0x0;
    local_d8._40_8_ = (Scalar *)0x0;
    local_d8._48_8_ = (StorageIndex *)0x0;
    local_d8._56_8_ = 0;
    local_d8._64_8_ = 0;
    Eigen::SparseMatrix<double,_1,_int>::resize
              ((SparseMatrix<double,_1,_int> *)local_d8,lVar14 + 1,lVar14 + 1);
    uVar8 = local_dc;
    if (local_d8[0] == true) {
      pbVar1 = (pointer)(this->_quadmat).m_outerSize;
      pbVar13 = (pointer)(this->_quadmat).m_innerSize;
      (this->_quadmat).m_outerSize = local_d8._8_8_;
      (this->_quadmat).m_innerSize = local_d8._16_8_;
      pSVar2 = (this->_quadmat).m_outerIndex;
      pSVar3 = (this->_quadmat).m_innerNonZeros;
      (this->_quadmat).m_outerIndex = (StorageIndex *)local_d8._24_8_;
      (this->_quadmat).m_innerNonZeros = (StorageIndex *)local_d8._32_8_;
      pSVar4 = (this->_quadmat).m_data.m_values;
      pSVar5 = (this->_quadmat).m_data.m_indices;
      (this->_quadmat).m_data.m_values = (Scalar *)local_d8._40_8_;
      (this->_quadmat).m_data.m_indices = (StorageIndex *)local_d8._48_8_;
      IVar6 = (this->_quadmat).m_data.m_size;
      IVar7 = (this->_quadmat).m_data.m_allocatedSize;
      (this->_quadmat).m_data.m_size = local_d8._56_8_;
      (this->_quadmat).m_data.m_allocatedSize = local_d8._64_8_;
      local_d8._8_8_ = pbVar1;
      local_d8._16_8_ = pbVar13;
      local_d8._24_8_ = pSVar2;
      local_d8._32_8_ = pSVar3;
      local_d8._40_8_ = pSVar4;
      local_d8._48_8_ = pSVar5;
      local_d8._56_8_ = IVar6;
      local_d8._64_8_ = IVar7;
    }
    else if ((BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
              *)local_d8 != this) {
      Eigen::SparseMatrix<double,1,int>::initAssignment<Eigen::SparseMatrix<double,1,int>>
                ((SparseMatrix<double,1,int> *)this,(SparseMatrix<double,_1,_int> *)local_d8);
      if ((StorageIndex *)local_d8._32_8_ == (StorageIndex *)0x0) {
        __n = (this->_quadmat).m_outerSize * 4 + 4;
        if (__n != 0) {
          memcpy((this->_quadmat).m_outerIndex,(void *)local_d8._24_8_,__n);
        }
        Eigen::internal::CompressedStorage<double,_int>::operator=
                  (&(this->_quadmat).m_data,(CompressedStorage<double,_int> *)(local_d8 + 0x28));
      }
      else {
        Eigen::internal::
        assign_sparse_to_sparse<Eigen::SparseMatrix<double,1,int>,Eigen::SparseMatrix<double,1,int>>
                  (&this->_quadmat,(SparseMatrix<double,_1,_int> *)local_d8);
      }
    }
    free((void *)local_d8._24_8_);
    free((void *)local_d8._32_8_);
    Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage
              ((CompressedStorage<double,_int> *)(local_d8 + 0x28));
    (this->_quadmat).m_data.m_size = 0;
    memset((this->_quadmat).m_outerIndex,0,(this->_quadmat).m_outerSize * 4 + 4);
    pSVar2 = (this->_quadmat).m_innerNonZeros;
    if (pSVar2 != (StorageIndex *)0x0) {
      memset(pSVar2,0,(this->_quadmat).m_outerSize << 2);
    }
    _add_triangular_elements<cimod::Sparse>
              (this,mat,SUB41(uVar8,0),(dispatch_t<cimod::Sparse,_Sparse>)0x0);
    pSVar11 = Eigen::SparseMatrix<double,_1,_int>::coeffRef(&this->_quadmat,lVar14,lVar14);
    *pSVar11 = 1.0;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"matrix must be a square matrix");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void _initialize_quadmat( const DenseMatrix &mat, const std::vector<IndexType> &labels_vec, bool fix_format ) {

      // initlaize label <-> index dict
      std::unordered_set<IndexType> labels( labels_vec.begin(), labels_vec.end() );
      _idx_to_label = std::vector<IndexType>( labels.begin(), labels.end() );
      std::sort( _idx_to_label.begin(), _idx_to_label.end() );
      _set_label_to_idx();

      if ( mat.rows() != mat.cols() ) {
        throw std::runtime_error( "matrix must be a square matrix" );
      }

      size_t mat_size = _idx_to_label.size() + 1;
      _quadmat = Matrix( mat_size, mat_size );
      _quadmat.setZero();
      _add_triangular_elements( mat, fix_format );
      _quadmat_get( mat_size - 1, mat_size - 1 ) = 1;
    }